

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::PatternCaseStatement::ItemGroup>::
emplaceRealloc<slang::ast::PatternCaseStatement::ItemGroup>
          (SmallVectorBase<slang::ast::PatternCaseStatement::ItemGroup> *this,pointer pos,
          ItemGroup *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  Expression *pEVar3;
  ItemGroup *__cur_1;
  pointer pIVar4;
  pointer pIVar5;
  pointer pIVar6;
  pointer pIVar7;
  Statement *pSVar8;
  Statement *ctx;
  long lVar9;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  pSVar8 = (Statement *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (Statement *)(uVar1 * 2);
  if (pSVar8 < ctx) {
    pSVar8 = ctx;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    pSVar8 = (Statement *)0x555555555555555;
  }
  lVar9 = (long)pos - (long)this->data_;
  pIVar4 = (pointer)operator_new((long)pSVar8 * 0x18);
  *(Statement **)((long)pIVar4 + lVar9 + 0x10) = (args->stmt).ptr;
  pEVar3 = args->filter;
  *(undefined8 *)((long)pIVar4 + lVar9) = (args->pattern).ptr;
  ((undefined8 *)((long)pIVar4 + lVar9))[1] = pEVar3;
  pIVar7 = this->data_;
  pIVar5 = pIVar7 + this->len;
  pIVar6 = pIVar4;
  if (pIVar5 == pos) {
    for (; pIVar7 != pos; pIVar7 = pIVar7 + 1) {
      (pIVar6->stmt).ptr = (pIVar7->stmt).ptr;
      pEVar3 = pIVar7->filter;
      (pIVar6->pattern).ptr = (pIVar7->pattern).ptr;
      pIVar6->filter = pEVar3;
      pIVar6 = pIVar6 + 1;
    }
  }
  else {
    for (; pIVar7 != pos; pIVar7 = pIVar7 + 1) {
      ctx = (pIVar7->stmt).ptr;
      (pIVar6->stmt).ptr = ctx;
      pEVar3 = pIVar7->filter;
      (pIVar6->pattern).ptr = (pIVar7->pattern).ptr;
      pIVar6->filter = pEVar3;
      pIVar6 = pIVar6 + 1;
    }
    puVar2 = (undefined8 *)(lVar9 + (long)pIVar4);
    for (; pos != pIVar5; pos = pos + 1) {
      puVar2[5] = (pos->stmt).ptr;
      pEVar3 = pos->filter;
      puVar2[3] = (pos->pattern).ptr;
      puVar2[4] = pEVar3;
      puVar2 = puVar2 + 3;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pSVar8;
  this->data_ = pIVar4;
  return (pointer)((long)pIVar4 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}